

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

char * config_find_string_fallback(map *config_map,char *key,char *fallback)

{
  natwm_error nVar1;
  map *local_30;
  char *string;
  char *fallback_local;
  char *key_local;
  map *config_map_local;
  
  local_30 = (map *)0x0;
  string = fallback;
  fallback_local = key;
  key_local = (char *)config_map;
  nVar1 = config_find_string(config_map,key,(char **)&local_30);
  if (nVar1 == NO_ERROR) {
    config_map_local = local_30;
  }
  else {
    config_map_local = (map *)string;
  }
  return (char *)config_map_local;
}

Assistant:

const char *config_find_string_fallback(const struct map *config_map, const char *key,
                                        const char *fallback)
{
        const char *string = NULL;

        if (config_find_string(config_map, key, &string) != NO_ERROR) {
                return fallback;
        }

        return string;
}